

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

int uv__io_uring_enter(int fd,uint to_submit,uint min_complete,uint flags)

{
  long lVar1;
  
  lVar1 = syscall(0x1aa,fd,to_submit,min_complete,(ulong)flags,0,0);
  return (int)lVar1;
}

Assistant:

int uv__io_uring_enter(int fd,
                       unsigned to_submit,
                       unsigned min_complete,
                       unsigned flags) {
  /* io_uring_enter used to take a sigset_t but it's unused
   * in newer kernels unless IORING_ENTER_EXT_ARG is set,
   * in which case it takes a struct io_uring_getevents_arg.
   */
  return syscall(__NR_io_uring_enter,
                 fd,
                 to_submit,
                 min_complete,
                 flags,
                 NULL,
                 0L);
}